

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastzip.cpp
# Opt level: O2

int store_compressed(File *f,int inSize,uint8_t *target,uint8_t *sha)

{
  int iVar1;
  undefined8 *puVar2;
  undefined1 auStack_10108 [8];
  uint8_t buf [65536];
  SHA_CTX context;
  mz_stream stream;
  
  File::Read<unsigned_char>(f,target,(long)inSize);
  if (sha != (uint8_t *)0x0) {
    context.data[0xf] = 0;
    context.num = 0;
    iVar1 = mz_inflateInit2((mz_streamp)(context.data + 0xf),-0xf);
    if (iVar1 != 0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar2 = &PTR__exception_001b5988;
      puVar2[1] = "Could not init miniz for compression";
      __cxa_throw(puVar2,&fastzip_exception::typeinfo,std::exception::~exception);
    }
    context._88_8_ = target;
    SHA1_Init((SHA_CTX *)(buf + 0xfff8));
    while (inSize != 0) {
      mz_inflate((mz_streamp)(context.data + 0xf),2);
      SHA1_Update((SHA_CTX *)(buf + 0xfff8),auStack_10108,0);
    }
    mz_inflate((mz_streamp)(context.data + 0xf),4);
    SHA1_Final(sha,(SHA_CTX *)(buf + 0xfff8));
  }
  return 0;
}

Assistant:

static int store_compressed(File& f, int inSize, uint8_t* target, uint8_t* sha)
{
    uint8_t* fileData = target;
    f.Read(fileData, inSize);

    int total = 0;
    if (sha) {
        uint8_t buf[65536];
        const int bufSize = sizeof(buf);

        mz_stream stream;
        memset(&stream, 0, sizeof(stream));
        if (mz_inflateInit2(&stream, -MZ_DEFAULT_WINDOW_BITS) != MZ_OK)
            throw fastzip_exception("Could not init miniz for compression");

        stream.next_in = fileData;
        stream.avail_in = inSize;

        SHA_CTX context;
        SHA1_Init(&context);

        while (stream.avail_in > 0) {
            stream.next_out = buf;
            stream.avail_out = bufSize;
            mz_inflate(&stream, MZ_SYNC_FLUSH);
            SHA1_Update(&context, buf, bufSize - stream.avail_out);
            total += (bufSize - stream.avail_out);
        }

        mz_inflate(&stream, MZ_FINISH);

        SHA1_Final(sha, &context);
    }
    return total;
}